

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O1

void __thiscall APITests::test_cleanup_multiple_channels(APITests *this)

{
  long lVar1;
  runtime_error *this_00;
  Warning w;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  int local_1a8;
  int local_1a4;
  Warning local_1a0;
  
  GPIO::setwarnings(false);
  Warning::Warning(&local_1a0);
  GPIO::setmode(BOARD);
  GPIO::setup((this->pin_data).in_a,IN,-1);
  GPIO::setup((this->pin_data).in_b,IN,-1);
  GPIO::setup((this->pin_data).out_a,OUT,-1);
  local_1a8 = (this->pin_data).in_a;
  local_1c8 = (long *)&local_1a8;
  local_1a4 = (this->pin_data).in_b;
  local_1c0 = 2;
  GPIO::cleanup((initializer_list *)&local_1c8);
  std::__cxx11::stringbuf::str();
  lVar1 = local_1c0;
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  if (lVar1 == 0) {
    GPIO::cleanup();
    Warning::~Warning(&local_1a0);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unexpected warning occured");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_cleanup_multiple_channels()
    {
        GPIO::setwarnings(false);
        Warning w{};

        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.in_a, GPIO::IN);
        GPIO::setup(pin_data.in_b, GPIO::IN);
        GPIO::setup(pin_data.out_a, GPIO::OUT);

        GPIO::cleanup({pin_data.in_a, pin_data.in_b});

        if (!w.contents().empty())
            throw std::runtime_error("Unexpected warning occured");

        GPIO::cleanup();
    }